

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skin.cpp
# Opt level: O1

void * rw::skinOpen(void *o,int32 param_2,int32 param_3)

{
  Pipeline *pPVar1;
  long lVar2;
  
  DAT_0014a2e0 = ObjPipeline::create();
  pPVar1 = &DAT_0014a2e0->super_Pipeline;
  (DAT_0014a2e0->super_Pipeline).pluginID = 0x116;
  pPVar1->pluginData = 1;
  lVar2 = 1;
  do {
    *(ObjPipeline **)(&skinGlobals + lVar2 * 2) = DAT_0014a2e0;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0xe);
  return o;
}

Assistant:

static void*
skinOpen(void *o, int32, int32)
{
	// init dummy pipelines
	skinGlobals.dummypipe = ObjPipeline::create();
	skinGlobals.dummypipe->pluginID = ID_SKIN;
	skinGlobals.dummypipe->pluginData = 1;
	for(uint i = 0; i < nelem(skinGlobals.pipelines); i++)
		skinGlobals.pipelines[i] = skinGlobals.dummypipe;
	return o;
}